

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O1

void __thiscall jrtplib::RTPUDPv6Transmitter::ClearAcceptList(RTPUDPv6Transmitter *this)

{
  if (((this->init == true) && (this->created == true)) && (this->receivemode == AcceptSome)) {
    ClearAcceptIgnoreInfo(this);
    return;
  }
  return;
}

Assistant:

void RTPUDPv6Transmitter::ClearAcceptList()
{
	if (!init)
		return;
	
	MAINMUTEX_LOCK
	if (created && receivemode == RTPTransmitter::AcceptSome)
		ClearAcceptIgnoreInfo();
	MAINMUTEX_UNLOCK
}